

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

void __thiscall smf::MidiFile::splitTracks(MidiFile *this)

{
  int iVar1;
  pointer ppMVar2;
  MidiEventList *this_00;
  int iVar3;
  MidiEvent *pMVar4;
  MidiEventList *pMVar5;
  ulong uVar6;
  int index;
  int iVar7;
  
  if (this->m_theTrackState != 0) {
    iVar1 = this->m_theTimeState;
    if (iVar1 == 0) {
      makeAbsoluteTicks(this);
    }
    iVar3 = MidiEventList::size(*(this->m_events).
                                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    iVar7 = 0;
    if (0 < iVar3) {
      index = 0;
      do {
        pMVar4 = MidiEventList::operator[]
                           (*(this->m_events).
                             super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,index);
        if (iVar7 < pMVar4->track) {
          pMVar4 = MidiEventList::operator[]
                             (*(this->m_events).
                               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>
                               ._M_impl.super__Vector_impl_data._M_start,index);
          iVar7 = pMVar4->track;
        }
        index = index + 1;
      } while (iVar3 != index);
    }
    if (0 < iVar7) {
      ppMVar2 = (this->m_events).
                super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this_00 = *ppMVar2;
      *ppMVar2 = (MidiEventList *)0x0;
      std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
                (&this->m_events,(ulong)(iVar7 + 1));
      uVar6 = 0;
      do {
        pMVar5 = (MidiEventList *)operator_new(0x18);
        MidiEventList::MidiEventList(pMVar5);
        (this->m_events).
        super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = pMVar5;
        uVar6 = uVar6 + 1;
      } while (iVar7 + 1 != uVar6);
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          pMVar4 = MidiEventList::operator[](this_00,iVar7);
          pMVar5 = (this->m_events).
                   super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[pMVar4->track];
          pMVar4 = MidiEventList::operator[](this_00,iVar7);
          MidiEventList::push_back_no_copy(pMVar5,pMVar4);
          iVar7 = iVar7 + 1;
        } while (iVar3 != iVar7);
      }
      MidiEventList::detach(this_00);
      MidiEventList::~MidiEventList(this_00);
      operator_delete(this_00);
      if (iVar1 == 0) {
        makeDeltaTicks(this);
      }
      this->m_theTrackState = 0;
    }
  }
  return;
}

Assistant:

void MidiFile::splitTracks(void) {
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}
	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	int length = m_events[0]->size();
	for (i=0; i<length; i++) {
		if ((*m_events[0])[i].track > maxTrack) {
			maxTrack = (*m_events[0])[i].track;
		}
	}
	int m_trackCount = maxTrack + 1;

	if (m_trackCount <= 1) {
		return;
	}

	MidiEventList* olddata = m_events[0];
	m_events[0] = NULL;
	m_events.resize(m_trackCount);
	for (i=0; i<m_trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = (*olddata)[i].track;
		m_events[trackValue]->push_back_no_copy(&(*olddata)[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}